

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

string * leftJustify(string *__return_storage_ptr__,string *input,int width)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  allocator<char> local_49;
  int local_48;
  int local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  string *psStack_18;
  int width_local;
  string *input_local;
  
  local_1c = width;
  psStack_18 = input;
  input_local = __return_storage_ptr__;
  uVar2 = utf8_text_width(input);
  local_44 = width - uVar2;
  local_48 = 0;
  piVar3 = std::max<int>(&local_44,&local_48);
  iVar1 = *piVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,(long)iVar1,' ',&local_49);
  std::operator+(__return_storage_ptr__,input,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_49);
  return __return_storage_ptr__;
}

Assistant:

std::string leftJustify (const std::string& input, const int width)
{
  return input + std::string (std::max<int> (width - utf8_text_width (input), 0), ' ');
}